

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::TanH_x86_avx::forward_inplace(TanH_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  void *pvVar4;
  int iVar5;
  undefined1 (*pauVar6) [32];
  int _c;
  int iVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  float fVar11;
  undefined1 auVar12 [16];
  float fVar27;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar25;
  float fVar26;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 in_ZMM0 [64];
  undefined1 auVar24 [64];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  float fVar47;
  float fVar51;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  float fVar45;
  float fVar46;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 in_ZMM1 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  Mat local_78;
  
  iVar7 = bottom_top_blob->c;
  iVar9 = bottom_top_blob->h * bottom_top_blob->w;
  _c = 0;
  if (bottom_top_blob->elempack == 8) {
    if (iVar9 < 1) {
      iVar9 = _c;
    }
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    for (; _c != iVar7; _c = _c + 1) {
      in_ZMM0 = ZEXT1664(in_ZMM0._0_16_);
      in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar6 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      auVar68._8_4_ = 0x3f800000;
      auVar68._0_8_ = 0x3f8000003f800000;
      auVar68._12_4_ = 0x3f800000;
      auVar68._16_4_ = 0x3f800000;
      auVar68._20_4_ = 0x3f800000;
      auVar68._24_4_ = 0x3f800000;
      auVar68._28_4_ = 0x3f800000;
      auVar66._8_4_ = 0xc2b0c0a5;
      auVar66._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar66._12_4_ = 0xc2b0c0a5;
      auVar66._16_4_ = 0xc2b0c0a5;
      auVar66._20_4_ = 0xc2b0c0a5;
      auVar66._24_4_ = 0xc2b0c0a5;
      auVar66._28_4_ = 0xc2b0c0a5;
      auVar63._8_4_ = 0x42b0c0a5;
      auVar63._0_8_ = 0x42b0c0a542b0c0a5;
      auVar63._12_4_ = 0x42b0c0a5;
      auVar63._16_4_ = 0x42b0c0a5;
      auVar63._20_4_ = 0x42b0c0a5;
      auVar63._24_4_ = 0x42b0c0a5;
      auVar63._28_4_ = 0x42b0c0a5;
      iVar5 = iVar9;
      while (bVar10 = iVar5 != 0, iVar5 = iVar5 + -1, bVar10) {
        auVar24._0_4_ = *(float *)*pauVar6 * -2.0;
        auVar24._4_4_ = *(float *)(*pauVar6 + 4) * -2.0;
        auVar24._8_4_ = *(float *)(*pauVar6 + 8) * -2.0;
        auVar24._12_4_ = *(float *)(*pauVar6 + 0xc) * -2.0;
        auVar24._16_4_ = *(float *)(*pauVar6 + 0x10) * -2.0;
        auVar24._20_4_ = *(float *)(*pauVar6 + 0x14) * -2.0;
        auVar24._28_36_ = in_ZMM0._28_36_;
        auVar24._24_4_ = *(float *)(*pauVar6 + 0x18) * -2.0;
        auVar21 = vminps_avx(auVar24._0_32_,auVar63);
        auVar1 = vmaxps_avx(auVar21,auVar66);
        auVar39._0_4_ = auVar1._0_4_ * 1.442695 + 0.5;
        auVar39._4_4_ = auVar1._4_4_ * 1.442695 + 0.5;
        auVar39._8_4_ = auVar1._8_4_ * 1.442695 + 0.5;
        auVar39._12_4_ = auVar1._12_4_ * 1.442695 + 0.5;
        auVar39._16_4_ = auVar1._16_4_ * 1.442695 + 0.5;
        auVar39._20_4_ = auVar1._20_4_ * 1.442695 + 0.5;
        auVar39._24_4_ = auVar1._24_4_ * 1.442695 + 0.5;
        auVar39._28_4_ = in_ZMM1._28_4_ + 0.5;
        auVar59 = vroundps_avx(auVar39,1);
        auVar21 = vcmpps_avx(auVar39,auVar59,1);
        auVar21 = vandps_avx(auVar68,auVar21);
        auVar21 = vsubps_avx(auVar59,auVar21);
        fVar11 = auVar1._0_4_ + auVar21._0_4_ * -0.6931472;
        fVar25 = auVar1._4_4_ + auVar21._4_4_ * -0.6931472;
        fVar26 = auVar1._8_4_ + auVar21._8_4_ * -0.6931472;
        fVar27 = auVar1._12_4_ + auVar21._12_4_ * -0.6931472;
        fVar28 = auVar1._16_4_ + auVar21._16_4_ * -0.6931472;
        fVar29 = auVar1._20_4_ + auVar21._20_4_ * -0.6931472;
        fVar30 = auVar1._24_4_ + auVar21._24_4_ * -0.6931472;
        auVar34._0_4_ = (int)auVar21._0_4_;
        auVar34._4_4_ = (int)auVar21._4_4_;
        auVar34._8_4_ = (int)auVar21._8_4_;
        auVar34._12_4_ = (int)auVar21._12_4_;
        auVar40._16_4_ = (int)auVar21._16_4_;
        auVar40._0_16_ = auVar34;
        auVar40._20_4_ = (int)auVar21._20_4_;
        auVar40._24_4_ = (int)auVar21._24_4_;
        auVar40._28_4_ = (int)auVar21._28_4_;
        auVar53 = vpslld_avx(auVar34,0x17);
        auVar34 = vpslld_avx(auVar40._16_16_,0x17);
        auVar56._8_4_ = 0x3f800000;
        auVar56._0_8_ = 0x3f8000003f800000;
        auVar56._12_4_ = 0x3f800000;
        auVar34 = vpaddd_avx(auVar34,auVar56);
        auVar53 = vpaddd_avx(auVar53,auVar56);
        auVar20._0_4_ =
             (fVar11 + 1.0 +
             fVar11 * fVar11 *
             (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) * fVar11 +
               0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5)) * auVar53._0_4_ + 1.0;
        auVar20._4_4_ =
             (fVar25 + 1.0 +
             fVar25 * fVar25 *
             (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
               0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5)) * auVar53._4_4_ + 1.0;
        auVar20._8_4_ =
             (fVar26 + 1.0 +
             fVar26 * fVar26 *
             (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
               0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar53._8_4_ + 1.0;
        auVar20._12_4_ =
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar53._12_4_ + 1.0;
        auVar20._16_4_ =
             (fVar28 + 1.0 +
             fVar28 * fVar28 *
             (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
               0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5)) * auVar34._0_4_ + 1.0;
        auVar20._20_4_ =
             (fVar29 + 1.0 +
             fVar29 * fVar29 *
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar34._4_4_ + 1.0;
        auVar20._24_4_ =
             (fVar30 + 1.0 +
             fVar30 * fVar30 *
             (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
               0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5)) * auVar34._8_4_ + 1.0;
        auVar20._28_4_ = auVar1._28_4_ + auVar59._28_4_ + 1.0 + auVar59._28_4_ + 1.0;
        auVar21 = vrcpps_avx(auVar20);
        fVar11 = auVar21._0_4_;
        fVar25 = auVar21._4_4_;
        fVar26 = auVar21._8_4_;
        fVar27 = auVar21._12_4_;
        fVar28 = auVar21._16_4_;
        fVar29 = auVar21._20_4_;
        fVar30 = auVar21._24_4_;
        auVar1._4_4_ = auVar20._4_4_ * (fVar25 + fVar25);
        auVar1._0_4_ = auVar20._0_4_ * (fVar11 + fVar11);
        auVar1._8_4_ = auVar20._8_4_ * (fVar26 + fVar26);
        auVar1._12_4_ = auVar20._12_4_ * (fVar27 + fVar27);
        auVar1._16_4_ = auVar20._16_4_ * (fVar28 + fVar28);
        auVar1._20_4_ = auVar20._20_4_ * (fVar29 + fVar29);
        auVar1._24_4_ = auVar20._24_4_ * (fVar30 + fVar30);
        auVar1._28_4_ = auVar20._28_4_;
        auVar59._8_4_ = 0x40000000;
        auVar59._0_8_ = 0x4000000040000000;
        auVar59._12_4_ = 0x40000000;
        auVar59._16_4_ = 0x40000000;
        auVar59._20_4_ = 0x40000000;
        auVar59._24_4_ = 0x40000000;
        auVar59._28_4_ = 0x40000000;
        auVar1 = vsubps_avx(auVar59,auVar1);
        fVar31 = fVar11 + fVar11 + -1.0;
        fVar45 = fVar25 + fVar25 + -1.0;
        fVar46 = fVar26 + fVar26 + -1.0;
        fVar47 = fVar27 + fVar27 + -1.0;
        fVar48 = fVar28 + fVar28 + -1.0;
        fVar49 = fVar29 + fVar29 + -1.0;
        fVar50 = fVar30 + fVar30 + -1.0;
        fVar51 = auVar21._28_4_ + auVar21._28_4_ + -1.0;
        in_ZMM1 = ZEXT3264(CONCAT428(fVar51,CONCAT424(fVar50,CONCAT420(fVar49,CONCAT416(fVar48,
                                                  CONCAT412(fVar47,CONCAT48(fVar46,CONCAT44(fVar45,
                                                  fVar31))))))));
        auVar21._0_4_ = fVar31 + fVar11 * auVar1._0_4_;
        auVar21._4_4_ = fVar45 + fVar25 * auVar1._4_4_;
        auVar21._8_4_ = fVar46 + fVar26 * auVar1._8_4_;
        auVar21._12_4_ = fVar47 + fVar27 * auVar1._12_4_;
        auVar21._16_4_ = fVar48 + fVar28 * auVar1._16_4_;
        auVar21._20_4_ = fVar49 + fVar29 * auVar1._20_4_;
        auVar21._24_4_ = fVar50 + fVar30 * auVar1._24_4_;
        auVar21._28_4_ = fVar51 + auVar1._28_4_;
        in_ZMM0 = ZEXT3264(auVar21);
        *pauVar6 = auVar21;
        pauVar6 = pauVar6 + 1;
      }
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (iVar9 < 1) {
      iVar9 = _c;
    }
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    for (; _c != iVar7; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pauVar6 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      auVar67._8_4_ = 0x3f800000;
      auVar67._0_8_ = 0x3f8000003f800000;
      auVar67._12_4_ = 0x3f800000;
      auVar65._8_4_ = 0xc2b0c0a5;
      auVar65._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar65._12_4_ = 0xc2b0c0a5;
      auVar62._8_4_ = 0x42b0c0a5;
      auVar62._0_8_ = 0x42b0c0a542b0c0a5;
      auVar62._12_4_ = 0x42b0c0a5;
      iVar5 = iVar9;
      while (bVar10 = iVar5 != 0, iVar5 = iVar5 + -1, bVar10) {
        auVar12._0_4_ = *(float *)*pauVar6 * -2.0;
        auVar12._4_4_ = *(float *)(*pauVar6 + 4) * -2.0;
        auVar12._8_4_ = *(float *)(*pauVar6 + 8) * -2.0;
        auVar12._12_4_ = *(float *)(*pauVar6 + 0xc) * -2.0;
        auVar34 = vminps_avx(auVar12,auVar62);
        auVar56 = vmaxps_avx(auVar34,auVar65);
        auVar32._0_4_ = auVar56._0_4_ * 1.442695 + 0.5;
        auVar32._4_4_ = auVar56._4_4_ * 1.442695 + 0.5;
        auVar32._8_4_ = auVar56._8_4_ * 1.442695 + 0.5;
        auVar32._12_4_ = auVar56._12_4_ * 1.442695 + 0.5;
        auVar52._0_4_ = (int)auVar32._0_4_;
        auVar52._4_4_ = (int)auVar32._4_4_;
        auVar52._8_4_ = (int)auVar32._8_4_;
        auVar52._12_4_ = (int)auVar32._12_4_;
        auVar53 = vcvtdq2ps_avx(auVar52);
        auVar34 = vcmpps_avx(auVar32,auVar53,1);
        auVar34 = vandps_avx(auVar67,auVar34);
        auVar34 = vsubps_avx(auVar53,auVar34);
        fVar11 = auVar56._0_4_ + auVar34._0_4_ * -0.6931472;
        fVar25 = auVar56._4_4_ + auVar34._4_4_ * -0.6931472;
        fVar26 = auVar56._8_4_ + auVar34._8_4_ * -0.6931472;
        fVar27 = auVar56._12_4_ + auVar34._12_4_ * -0.6931472;
        auVar33._0_4_ = (int)auVar34._0_4_;
        auVar33._4_4_ = (int)auVar34._4_4_;
        auVar33._8_4_ = (int)auVar34._8_4_;
        auVar33._12_4_ = (int)auVar34._12_4_;
        auVar34 = vpslld_avx(auVar33,0x17);
        auVar34 = vpaddd_avx(auVar67,auVar34);
        auVar13._0_4_ =
             (fVar11 + 1.0 +
             fVar11 * fVar11 *
             (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) * fVar11 +
               0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5)) * auVar34._0_4_ + 1.0;
        auVar13._4_4_ =
             (fVar25 + 1.0 +
             fVar25 * fVar25 *
             (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
               0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5)) * auVar34._4_4_ + 1.0;
        auVar13._8_4_ =
             (fVar26 + 1.0 +
             fVar26 * fVar26 *
             (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
               0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar34._8_4_ + 1.0;
        auVar13._12_4_ =
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar34._12_4_ + 1.0;
        auVar34 = vrcpps_avx(auVar13);
        fVar11 = auVar34._0_4_;
        fVar25 = auVar34._4_4_;
        fVar26 = auVar34._8_4_;
        fVar27 = auVar34._12_4_;
        auVar14._0_4_ = auVar13._0_4_ * (fVar11 + fVar11);
        auVar14._4_4_ = auVar13._4_4_ * (fVar25 + fVar25);
        auVar14._8_4_ = auVar13._8_4_ * (fVar26 + fVar26);
        auVar14._12_4_ = auVar13._12_4_ * (fVar27 + fVar27);
        auVar55._8_4_ = 0x40000000;
        auVar55._0_8_ = 0x4000000040000000;
        auVar55._12_4_ = 0x40000000;
        auVar34 = vsubps_avx(auVar55,auVar14);
        auVar15._0_4_ = fVar11 + fVar11 + -1.0 + fVar11 * auVar34._0_4_;
        auVar15._4_4_ = fVar25 + fVar25 + -1.0 + fVar25 * auVar34._4_4_;
        auVar15._8_4_ = fVar26 + fVar26 + -1.0 + fVar26 * auVar34._8_4_;
        auVar15._12_4_ = fVar27 + fVar27 + -1.0 + fVar27 * auVar34._12_4_;
        *(undefined1 (*) [16])*pauVar6 = auVar15;
        pauVar6 = (undefined1 (*) [32])(*pauVar6 + 0x10);
      }
    }
  }
  else {
    if (iVar7 < 1) {
      iVar7 = _c;
    }
    for (; _c != iVar7; _c = _c + 1) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pvVar4 = local_78.data;
      Mat::~Mat(&local_78);
      lVar8 = 0;
      pauVar6 = (undefined1 (*) [32])pvVar4;
      for (iVar5 = 0; iVar5 + 7 < iVar9; iVar5 = iVar5 + 8) {
        auVar2._4_4_ = *(float *)(*pauVar6 + 4) * -2.0;
        auVar2._0_4_ = *(float *)*pauVar6 * -2.0;
        auVar2._8_4_ = *(float *)(*pauVar6 + 8) * -2.0;
        auVar2._12_4_ = *(float *)(*pauVar6 + 0xc) * -2.0;
        auVar2._16_4_ = *(float *)(*pauVar6 + 0x10) * -2.0;
        auVar2._20_4_ = *(float *)(*pauVar6 + 0x14) * -2.0;
        auVar2._24_4_ = *(float *)(*pauVar6 + 0x18) * -2.0;
        auVar2._28_4_ = 0xc0000000;
        auVar41._8_4_ = 0x42b0c0a5;
        auVar41._0_8_ = 0x42b0c0a542b0c0a5;
        auVar41._12_4_ = 0x42b0c0a5;
        auVar41._16_4_ = 0x42b0c0a5;
        auVar41._20_4_ = 0x42b0c0a5;
        auVar41._24_4_ = 0x42b0c0a5;
        auVar41._28_4_ = 0x42b0c0a5;
        auVar63 = vminps_avx(auVar2,auVar41);
        auVar42._8_4_ = 0xc2b0c0a5;
        auVar42._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar42._12_4_ = 0xc2b0c0a5;
        auVar42._16_4_ = 0xc2b0c0a5;
        auVar42._20_4_ = 0xc2b0c0a5;
        auVar42._24_4_ = 0xc2b0c0a5;
        auVar42._28_4_ = 0xc2b0c0a5;
        auVar66 = vmaxps_avx(auVar63,auVar42);
        auVar43._0_4_ = auVar66._0_4_ * 1.442695 + 0.5;
        auVar43._4_4_ = auVar66._4_4_ * 1.442695 + 0.5;
        auVar43._8_4_ = auVar66._8_4_ * 1.442695 + 0.5;
        auVar43._12_4_ = auVar66._12_4_ * 1.442695 + 0.5;
        auVar43._16_4_ = auVar66._16_4_ * 1.442695 + 0.5;
        auVar43._20_4_ = auVar66._20_4_ * 1.442695 + 0.5;
        auVar43._24_4_ = auVar66._24_4_ * 1.442695 + 0.5;
        auVar43._28_4_ = 0x3ff8aa3b;
        auVar68 = vroundps_avx(auVar43,1);
        auVar63 = vcmpps_avx(auVar43,auVar68,1);
        auVar64._8_4_ = 0x3f800000;
        auVar64._0_8_ = 0x3f8000003f800000;
        auVar64._12_4_ = 0x3f800000;
        auVar64._16_4_ = 0x3f800000;
        auVar64._20_4_ = 0x3f800000;
        auVar64._24_4_ = 0x3f800000;
        auVar64._28_4_ = 0x3f800000;
        auVar63 = vandps_avx(auVar63,auVar64);
        auVar63 = vsubps_avx(auVar68,auVar63);
        fVar11 = auVar66._0_4_ + auVar63._0_4_ * -0.6931472;
        fVar25 = auVar66._4_4_ + auVar63._4_4_ * -0.6931472;
        fVar26 = auVar66._8_4_ + auVar63._8_4_ * -0.6931472;
        fVar27 = auVar66._12_4_ + auVar63._12_4_ * -0.6931472;
        fVar28 = auVar66._16_4_ + auVar63._16_4_ * -0.6931472;
        fVar29 = auVar66._20_4_ + auVar63._20_4_ * -0.6931472;
        fVar30 = auVar66._24_4_ + auVar63._24_4_ * -0.6931472;
        auVar53._0_4_ = (int)auVar63._0_4_;
        auVar53._4_4_ = (int)auVar63._4_4_;
        auVar53._8_4_ = (int)auVar63._8_4_;
        auVar53._12_4_ = (int)auVar63._12_4_;
        auVar44._16_4_ = (int)auVar63._16_4_;
        auVar44._0_16_ = auVar53;
        auVar44._20_4_ = (int)auVar63._20_4_;
        auVar44._24_4_ = (int)auVar63._24_4_;
        auVar44._28_4_ = (int)auVar63._28_4_;
        auVar53 = vpslld_avx(auVar53,0x17);
        auVar34 = vpslld_avx(auVar44._16_16_,0x17);
        auVar57._8_4_ = 0x3f800000;
        auVar57._0_8_ = 0x3f8000003f800000;
        auVar57._12_4_ = 0x3f800000;
        auVar34 = vpaddd_avx(auVar34,auVar57);
        auVar53 = vpaddd_avx(auVar53,auVar57);
        auVar22._0_4_ =
             (fVar11 + 1.0 +
             fVar11 * fVar11 *
             (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) * fVar11 +
               0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5)) * auVar53._0_4_ + 1.0;
        auVar22._4_4_ =
             (fVar25 + 1.0 +
             fVar25 * fVar25 *
             (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
               0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5)) * auVar53._4_4_ + 1.0;
        auVar22._8_4_ =
             (fVar26 + 1.0 +
             fVar26 * fVar26 *
             (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
               0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar53._8_4_ + 1.0;
        auVar22._12_4_ =
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar53._12_4_ + 1.0;
        auVar22._16_4_ =
             (fVar28 + 1.0 +
             fVar28 * fVar28 *
             (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
               0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5)) * auVar34._0_4_ + 1.0;
        auVar22._20_4_ =
             (fVar29 + 1.0 +
             fVar29 * fVar29 *
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar34._4_4_ + 1.0;
        auVar22._24_4_ =
             (fVar30 + 1.0 +
             fVar30 * fVar30 *
             (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
               0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5)) * auVar34._8_4_ + 1.0;
        auVar22._28_4_ = auVar66._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
        auVar63 = vrcpps_avx(auVar22);
        fVar11 = auVar63._0_4_;
        fVar25 = auVar63._4_4_;
        fVar26 = auVar63._8_4_;
        fVar27 = auVar63._12_4_;
        fVar28 = auVar63._16_4_;
        fVar29 = auVar63._20_4_;
        fVar30 = auVar63._24_4_;
        auVar3._4_4_ = auVar22._4_4_ * (fVar25 + fVar25);
        auVar3._0_4_ = auVar22._0_4_ * (fVar11 + fVar11);
        auVar3._8_4_ = auVar22._8_4_ * (fVar26 + fVar26);
        auVar3._12_4_ = auVar22._12_4_ * (fVar27 + fVar27);
        auVar3._16_4_ = auVar22._16_4_ * (fVar28 + fVar28);
        auVar3._20_4_ = auVar22._20_4_ * (fVar29 + fVar29);
        auVar3._24_4_ = auVar22._24_4_ * (fVar30 + fVar30);
        auVar3._28_4_ = auVar22._28_4_;
        auVar60._8_4_ = 0x40000000;
        auVar60._0_8_ = 0x4000000040000000;
        auVar60._12_4_ = 0x40000000;
        auVar60._16_4_ = 0x40000000;
        auVar60._20_4_ = 0x40000000;
        auVar60._24_4_ = 0x40000000;
        auVar60._28_4_ = 0x40000000;
        auVar66 = vsubps_avx(auVar60,auVar3);
        auVar23._0_4_ = fVar11 + fVar11 + -1.0 + fVar11 * auVar66._0_4_;
        auVar23._4_4_ = fVar25 + fVar25 + -1.0 + fVar25 * auVar66._4_4_;
        auVar23._8_4_ = fVar26 + fVar26 + -1.0 + fVar26 * auVar66._8_4_;
        auVar23._12_4_ = fVar27 + fVar27 + -1.0 + fVar27 * auVar66._12_4_;
        auVar23._16_4_ = fVar28 + fVar28 + -1.0 + fVar28 * auVar66._16_4_;
        auVar23._20_4_ = fVar29 + fVar29 + -1.0 + fVar29 * auVar66._20_4_;
        auVar23._24_4_ = fVar30 + fVar30 + -1.0 + fVar30 * auVar66._24_4_;
        auVar23._28_4_ = auVar63._28_4_ + auVar63._28_4_ + -1.0 + auVar66._28_4_;
        *pauVar6 = auVar23;
        pauVar6 = pauVar6 + 1;
        lVar8 = lVar8 + 8;
      }
      for (; iVar5 + 3 < iVar9; iVar5 = iVar5 + 4) {
        auVar16._0_4_ = *(float *)*pauVar6 * -2.0;
        auVar16._4_4_ = *(float *)(*pauVar6 + 4) * -2.0;
        auVar16._8_4_ = *(float *)(*pauVar6 + 8) * -2.0;
        auVar16._12_4_ = *(float *)(*pauVar6 + 0xc) * -2.0;
        auVar35._8_4_ = 0x42b0c0a5;
        auVar35._0_8_ = 0x42b0c0a542b0c0a5;
        auVar35._12_4_ = 0x42b0c0a5;
        auVar34 = vminps_avx(auVar16,auVar35);
        auVar36._8_4_ = 0xc2b0c0a5;
        auVar36._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar36._12_4_ = 0xc2b0c0a5;
        auVar56 = vmaxps_avx(auVar34,auVar36);
        auVar37._0_4_ = auVar56._0_4_ * 1.442695 + 0.5;
        auVar37._4_4_ = auVar56._4_4_ * 1.442695 + 0.5;
        auVar37._8_4_ = auVar56._8_4_ * 1.442695 + 0.5;
        auVar37._12_4_ = auVar56._12_4_ * 1.442695 + 0.5;
        auVar54._0_4_ = (int)auVar37._0_4_;
        auVar54._4_4_ = (int)auVar37._4_4_;
        auVar54._8_4_ = (int)auVar37._8_4_;
        auVar54._12_4_ = (int)auVar37._12_4_;
        auVar53 = vcvtdq2ps_avx(auVar54);
        auVar34 = vcmpps_avx(auVar37,auVar53,1);
        auVar61._8_4_ = 0x3f800000;
        auVar61._0_8_ = 0x3f8000003f800000;
        auVar61._12_4_ = 0x3f800000;
        auVar34 = vandps_avx(auVar34,auVar61);
        auVar34 = vsubps_avx(auVar53,auVar34);
        fVar11 = auVar56._0_4_ + auVar34._0_4_ * -0.6931472;
        fVar25 = auVar56._4_4_ + auVar34._4_4_ * -0.6931472;
        fVar26 = auVar56._8_4_ + auVar34._8_4_ * -0.6931472;
        fVar27 = auVar56._12_4_ + auVar34._12_4_ * -0.6931472;
        auVar38._0_4_ = (int)auVar34._0_4_;
        auVar38._4_4_ = (int)auVar34._4_4_;
        auVar38._8_4_ = (int)auVar34._8_4_;
        auVar38._12_4_ = (int)auVar34._12_4_;
        auVar34 = vpslld_avx(auVar38,0x17);
        auVar34 = vpaddd_avx(auVar34,auVar61);
        auVar17._0_4_ =
             (fVar11 + 1.0 +
             fVar11 * fVar11 *
             (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) * fVar11 +
               0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5)) * auVar34._0_4_ + 1.0;
        auVar17._4_4_ =
             (fVar25 + 1.0 +
             fVar25 * fVar25 *
             (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
               0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5)) * auVar34._4_4_ + 1.0;
        auVar17._8_4_ =
             (fVar26 + 1.0 +
             fVar26 * fVar26 *
             (((((fVar26 * 0.00019875691 + 0.0013981999) * fVar26 + 0.008333452) * fVar26 +
               0.041665796) * fVar26 + 0.16666666) * fVar26 + 0.5)) * auVar34._8_4_ + 1.0;
        auVar17._12_4_ =
             (fVar27 + 1.0 +
             fVar27 * fVar27 *
             (((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
               0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5)) * auVar34._12_4_ + 1.0;
        auVar34 = vrcpps_avx(auVar17);
        fVar11 = auVar34._0_4_;
        fVar25 = auVar34._4_4_;
        fVar26 = auVar34._8_4_;
        fVar27 = auVar34._12_4_;
        auVar18._0_4_ = auVar17._0_4_ * (fVar11 + fVar11);
        auVar18._4_4_ = auVar17._4_4_ * (fVar25 + fVar25);
        auVar18._8_4_ = auVar17._8_4_ * (fVar26 + fVar26);
        auVar18._12_4_ = auVar17._12_4_ * (fVar27 + fVar27);
        auVar58._8_4_ = 0x40000000;
        auVar58._0_8_ = 0x4000000040000000;
        auVar58._12_4_ = 0x40000000;
        auVar34 = vsubps_avx(auVar58,auVar18);
        auVar19._0_4_ = fVar11 + fVar11 + -1.0 + fVar11 * auVar34._0_4_;
        auVar19._4_4_ = fVar25 + fVar25 + -1.0 + fVar25 * auVar34._4_4_;
        auVar19._8_4_ = fVar26 + fVar26 + -1.0 + fVar26 * auVar34._8_4_;
        auVar19._12_4_ = fVar27 + fVar27 + -1.0 + fVar27 * auVar34._12_4_;
        *(undefined1 (*) [16])*pauVar6 = auVar19;
        pauVar6 = (undefined1 (*) [32])(*pauVar6 + 0x10);
        lVar8 = lVar8 + 4;
      }
      for (; (int)lVar8 < iVar9; lVar8 = lVar8 + 1) {
        fVar11 = tanhf(*(float *)((undefined1 *)pvVar4 + lVar8 * 4));
        *(float *)((undefined1 *)pvVar4 + lVar8 * 4) = fVar11;
      }
    }
  }
  return 0;
}

Assistant:

int TanH_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = tanh_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = tanh_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}